

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::HashMap<int,_kj::String>::Entry>::truncate
          (ArrayBuilder<kj::HashMap<int,_kj::String>::Entry> *this,char *__file,__off_t __length)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  
  lVar1 = *(long *)this;
  uVar5 = *(ulong *)(this + 8);
  while (uVar4 = uVar5, (ulong)((long)__file * 0x20 + lVar1) < uVar4) {
    *(ulong *)(this + 8) = uVar4 - 0x20;
    lVar2 = *(long *)(uVar4 - 0x18);
    uVar5 = uVar4 - 0x20;
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)(uVar4 - 0x10);
      *(undefined8 *)(uVar4 - 0x18) = 0;
      *(undefined8 *)(uVar4 - 0x10) = 0;
      (**(code **)**(undefined8 **)(uVar4 - 8))(*(undefined8 **)(uVar4 - 8),lVar2,1,uVar3,uVar3,0);
      uVar5 = *(ulong *)(this + 8);
    }
  }
  return (int)uVar4;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }